

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void absl::lts_20250127::UnrefSynchEvent(SynchEvent *e)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  if (e == (SynchEvent *)0x0) {
    return;
  }
  if ((synch_event_mu & 1) == 0) {
    uVar2 = synch_event_mu | 1;
    LOCK();
    UNLOCK();
    uVar1 = synch_event_mu & 1;
    synch_event_mu = uVar2;
    if (uVar1 == 0) goto LAB_002a1d1d;
  }
  base_internal::SpinLock::SlowLock((SpinLock *)&synch_event_mu);
LAB_002a1d1d:
  iVar3 = e->refcount + -1;
  e->refcount = iVar3;
  uVar1 = synch_event_mu;
  uVar2 = synch_event_mu & 2;
  LOCK();
  UNLOCK();
  bVar4 = 7 < synch_event_mu;
  synch_event_mu = uVar2;
  if (bVar4) {
    base_internal::SpinLock::SlowUnlock((SpinLock *)&synch_event_mu,uVar1);
  }
  if (iVar3 != 0) {
    return;
  }
  base_internal::LowLevelAlloc::Free(e);
  return;
}

Assistant:

static void UnrefSynchEvent(SynchEvent* e) {
  if (e != nullptr) {
    synch_event_mu.Lock();
    bool del = (--(e->refcount) == 0);
    synch_event_mu.Unlock();
    if (del) {
      base_internal::LowLevelAlloc::Free(e);
    }
  }
}